

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O0

void __thiscall tst_qpromise_operators::move_void(tst_qpromise_operators *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int local_c4 [2];
  bool local_bb;
  bool local_ba;
  anon_class_1_0_00000001 local_b9;
  QPromise<void> local_b8;
  QString local_a8;
  QString local_90;
  QString local_78;
  bool local_5b;
  bool local_5a;
  anon_class_1_0_00000001 local_59;
  QPromise<void> local_58;
  int local_44 [3];
  bool local_35 [20];
  bool local_21;
  undefined1 local_20 [8];
  QPromise<void> p0;
  tst_qpromise_operators *this_local;
  
  p0.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this;
  QtPromise::QPromise<void>::resolve();
  local_21 = QtPromise::QPromiseBase<void>::isFulfilled((QPromiseBase<void> *)local_20);
  local_35[0] = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_21,local_35,"p0.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_44[1] = 0xffffffff;
    local_44[0] = 0x2a;
    iVar3 = waitForValue<int>((QPromise<void> *)local_20,local_44 + 1,local_44);
    bVar2 = QTest::qCompare(iVar3,0x2a,"waitForValue(p0, -1, 42)","42",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                            ,0x41);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      QtPromise::QPromise<void>::QPromise<tst_qpromise_operators::move_void()::__0>
                (&local_58,&local_59);
      QtPromise::QPromise<void>::operator=((QPromise<void> *)local_20,&local_58);
      QtPromise::QPromise<void>::~QPromise(&local_58);
      local_5a = QtPromise::QPromiseBase<void>::isPending((QPromiseBase<void> *)local_20);
      local_5b = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_5a,&local_5b,"p0.isPending()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0x4a);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        QString::QString(&local_90);
        waitForError<QString>(&local_78,(QPromise<void> *)local_20,&local_90);
        QString::QString(&local_a8,"foo");
        bVar1 = QTest::qCompare(&local_78,&local_a8,"waitForError(p0, QString{})","QString{\"foo\"}"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                                ,0x4b);
        QString::~QString(&local_a8);
        QString::~QString(&local_78);
        QString::~QString(&local_90);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          QtPromise::QPromise<void>::QPromise<tst_qpromise_operators::move_void()::__1>
                    (&local_b8,&local_b9);
          QtPromise::QPromise<void>::operator=((QPromise<void> *)local_20,&local_b8);
          QtPromise::QPromise<void>::~QPromise(&local_b8);
          local_ba = QtPromise::QPromiseBase<void>::isPending((QPromiseBase<void> *)local_20);
          local_bb = true;
          bVar1 = QTest::qCompare<bool,bool>
                            (&local_ba,&local_bb,"p0.isPending()","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0x53);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_c4[1] = 0xffffffff;
            local_c4[0] = 0x2b;
            iVar3 = waitForValue<int>((QPromise<void> *)local_20,local_c4 + 1,local_c4);
            bVar2 = QTest::qCompare(iVar3,0x2b,"waitForValue(p0, -1, 43)","43",
                                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                                    ,0x54);
            if (((bVar2 ^ 0xff) & 1) == 0) {
              local_44[2] = 0;
            }
            else {
              local_44[2] = 1;
            }
          }
          else {
            local_44[2] = 1;
          }
        }
        else {
          local_44[2] = 1;
        }
      }
      else {
        local_44[2] = 1;
      }
    }
    else {
      local_44[2] = 1;
    }
  }
  else {
    local_44[2] = 1;
  }
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_20);
  return;
}

Assistant:

void tst_qpromise_operators::move_void()
{
    auto p0 = QtPromise::QPromise<void>::resolve();

    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(waitForValue(p0, -1, 42), 42);

    p0 = QtPromise::QPromise<void>{
        [](const QtPromise::QPromiseResolve<void>&, const QtPromise::QPromiseReject<void>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});

    p0 = QtPromise::QPromise<void>{[](const QtPromise::QPromiseResolve<void>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve();
        });
    }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForValue(p0, -1, 43), 43);
}